

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int lyxp_node_atomize(lys_node *node,lyxp_set *set,int set_ext_dep_flags)

{
  ushort *puVar1;
  uint16_t uVar2;
  LYS_NODE LVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  lys_node *node_00;
  lys_node *plVar8;
  char *__ptr;
  lys_module *plVar9;
  lys_module *mod2;
  lys_node *plVar10;
  ulong uVar11;
  ly_ctx *ctx;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  byte bVar15;
  long lVar16;
  uint uVar17;
  bool bVar18;
  undefined1 auStack_b8 [8];
  lyxp_set tmp_set;
  lys_node *local_60;
  lys_node *ctx_snode;
  char *local_50;
  lys_node *local_48;
  uint local_40;
  uint local_3c;
  char *local_38;
  
  local_60 = (lys_node *)0x0;
  tmp_set.ht = (hash_table *)0x0;
  tmp_set.ctx_pos = 0;
  tmp_set.ctx_size = 0;
  tmp_set.val._8_8_ = 0;
  tmp_set.used = 0;
  tmp_set.size = 0;
  tmp_set._8_8_ = 0;
  tmp_set.val.nodes = (lyxp_set_node *)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  tmp_set.type = LYXP_SET_EMPTY;
  tmp_set._4_4_ = 0;
  set->ctx_pos = 0;
  set->ctx_size = 0;
  *(undefined8 *)&set->field_0x38 = 0;
  set->used = 0;
  set->size = 0;
  set->ht = (hash_table *)0x0;
  (set->val).nodes = (lyxp_set_node *)0x0;
  *(undefined8 *)((long)&set->val + 8) = 0;
  *(undefined8 *)set = 0;
  *(undefined8 *)&set->field_0x8 = 0;
  node_00 = node;
  if (node != (lys_node *)0x0) {
    do {
      if (node_00->nodetype == LYS_OUTPUT) {
        uVar17 = 0x20;
        goto LAB_00175dae;
      }
      node_00 = lys_parent(node_00);
    } while (node_00 != (lys_node *)0x0);
  }
  node_00 = (lys_node *)0x0;
  uVar17 = 0;
LAB_00175dae:
  LVar3 = node->nodetype;
  plVar10 = (lys_node *)0x0;
  bVar15 = 0;
  if ((int)LVar3 < 0x80) {
    if ((int)LVar3 < 0x10) {
      local_38 = (char *)0x0;
      bVar15 = 0;
      switch(LVar3) {
      case LYS_CONTAINER:
        plVar10 = (lys_node *)node[1].name;
        local_38 = node[1].dsc;
        bVar15 = node->padding[1];
        break;
      case LYS_CHOICE:
switchD_00175de2_caseD_2:
        plVar10 = *(lys_node **)node->hash;
      default:
switchD_00175de2_default:
        bVar15 = 0;
        local_38 = (char *)0x0;
        break;
      case LYS_CHOICE|LYS_CONTAINER:
      case LYS_LEAF|LYS_CONTAINER:
      case LYS_LEAF|LYS_CHOICE:
      case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
        break;
      case LYS_LEAF:
      case LYS_LEAFLIST:
switchD_00175de2_caseD_4:
        local_38 = node[1].dsc;
        bVar15 = node->padding[3];
        plVar10 = (lys_node *)node[1].name;
      }
    }
    else if (LVar3 == LYS_LIST) {
      local_38 = node[1].dsc;
      bVar15 = node->padding[0];
      plVar10 = (lys_node *)node[1].name;
    }
    else {
      if (LVar3 == LYS_ANYXML) goto switchD_00175de2_caseD_4;
      local_38 = (char *)0x0;
      if (LVar3 == LYS_CASE) goto switchD_00175de2_caseD_2;
    }
  }
  else {
    plVar10 = (lys_node *)0x0;
    if ((int)LVar3 < 0x1000) {
      if (LVar3 == LYS_NOTIF) {
        local_38 = node[1].dsc;
      }
      else {
        if ((LVar3 != LYS_INPUT) && (local_38 = (char *)0x0, LVar3 != LYS_OUTPUT))
        goto switchD_00175de2_caseD_3;
        local_38 = node[1].name;
      }
      bVar15 = node->padding[1];
      plVar10 = (lys_node *)0x0;
    }
    else {
      if (LVar3 == LYS_USES) goto switchD_00175de2_caseD_2;
      if (LVar3 == LYS_AUGMENT) {
        plVar10 = node->next;
        goto switchD_00175de2_default;
      }
      local_38 = (char *)0x0;
      if (LVar3 == LYS_ANYDATA) goto switchD_00175de2_caseD_4;
    }
  }
switchD_00175de2_caseD_3:
  plVar8 = node;
  if (set_ext_dep_flags != 0) {
    do {
      node_00 = plVar8;
      if ((node_00->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) != LYS_UNKNOWN) goto LAB_00175ed0;
      plVar8 = lys_parent(node_00);
    } while (plVar8 != (lys_node *)0x0);
    node_00 = (lys_node *)0x0;
  }
LAB_00175ed0:
  ctx_snode._4_4_ = set_ext_dep_flags;
  local_48 = node;
  if (plVar10 != (lys_node *)0x0) {
    iVar6 = lyxp_atomize(plVar10->name,node,LYXP_NODE_ELEM,(lyxp_set *)auStack_b8,uVar17 | 0x10,
                         &local_60);
    if (iVar6 != 0) {
      free((void *)tmp_set._8_8_);
      if (local_60 == (lys_node *)0x0) {
        ctx = node->module->ctx;
        pcVar13 = plVar10->name;
        pcVar12 = "Invalid when condition \"%s\".";
LAB_001762bc:
        __ptr = (char *)0x0;
      }
      else {
        __ptr = lys_path(local_60,1);
        ctx = node->module->ctx;
        pcVar13 = plVar10->name;
        pcVar12 = "Invalid when condition \"%s\" with context node \"%s\".";
      }
LAB_001762bf:
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_LYS,node,pcVar12,pcVar13);
LAB_001762d3:
      free((set->val).nodes);
      set->ctx_pos = 0;
      set->ctx_size = 0;
      *(undefined8 *)&set->field_0x38 = 0;
      set->used = 0;
      set->size = 0;
      set->ht = (hash_table *)0x0;
      (set->val).nodes = (lyxp_set_node *)0x0;
      *(undefined8 *)((long)&set->val + 8) = 0;
      *(undefined8 *)set = 0;
      *(undefined8 *)&set->field_0x8 = 0;
      iVar6 = -1;
      goto LAB_001762f7;
    }
    local_3c = uVar17;
    if ((set_ext_dep_flags != 0) && (tmp_set.val._8_4_ != 0)) {
      uVar14 = 0;
      do {
        plVar8 = local_48;
        lVar16 = uVar14 * 0x10;
        if (*(int *)(tmp_set._8_8_ + 8 + lVar16) == 2) {
          local_40 = (uint)local_48->flags;
          tmp_set._56_8_ = lys_node_module(local_48);
          local_50 = plVar8->name;
          uVar2 = (*(lys_node **)(tmp_set._8_8_ + lVar16))->flags;
          plVar9 = lys_node_module(*(lys_node **)(tmp_set._8_8_ + lVar16));
          iVar6 = lyp_check_status((uint16_t)local_40,(lys_module *)tmp_set._56_8_,local_50,uVar2,
                                   plVar9,(char *)**(undefined8 **)(tmp_set._8_8_ + lVar16),plVar8);
          if (iVar6 != 0) goto LAB_001762a5;
          if (node_00 != (lys_node *)0x0) {
            plVar8 = *(lys_node **)(tmp_set._8_8_ + lVar16);
            bVar18 = plVar8 != (lys_node *)0x0;
            if (plVar8 != node_00 && bVar18) {
              do {
                plVar8 = lys_parent(plVar8);
                bVar18 = plVar8 != (lys_node *)0x0;
                if (plVar8 == (lys_node *)0x0) break;
              } while (plVar8 != node_00);
            }
            if (!bVar18) {
              uVar5 = *(ushort *)(*(long *)(tmp_set._8_8_ + lVar16) + 0x18);
              uVar4 = 0x200;
              if (((uVar5 & 1) == 0) && (uVar4 = 0x400, (uVar5 & 2) == 0)) {
                __assert_fail("tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_R",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                              ,0x22cc,
                              "int lyxp_node_atomize(const struct lys_node *, struct lyxp_set *, int)"
                             );
              }
              puVar1 = (ushort *)((long)&plVar10->ext + 2);
              *puVar1 = *puVar1 | uVar4;
              local_48->flags = local_48->flags | uVar4;
            }
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (tmp_set.val._8_8_ & 0xffffffff));
    }
    set_snode_merge(set,(lyxp_set *)auStack_b8);
    tmp_set.ht = (hash_table *)0x0;
    tmp_set.ctx_pos = 0;
    tmp_set.ctx_size = 0;
    tmp_set.val._8_8_ = 0;
    tmp_set.used = 0;
    tmp_set.size = 0;
    tmp_set._8_8_ = 0;
    tmp_set.val.nodes = (lyxp_set_node *)0x0;
    auStack_b8 = (undefined1  [8])0x0;
    tmp_set.type = LYXP_SET_EMPTY;
    tmp_set._4_4_ = 0;
    uVar17 = local_3c;
  }
  if (bVar15 != 0) {
    local_3c = uVar17 | 8;
    uVar14 = 0;
    do {
      node = local_48;
      iVar6 = ctx_snode._4_4_;
      local_50 = local_38 + uVar14 * 0x38;
      iVar7 = lyxp_atomize(*(char **)(local_38 + uVar14 * 0x38),local_48,LYXP_NODE_ELEM,
                           (lyxp_set *)auStack_b8,local_3c,&local_60);
      if (iVar7 != 0) {
        free((void *)tmp_set._8_8_);
        if (local_60 == (lys_node *)0x0) {
          ctx = node->module->ctx;
          pcVar13 = *(char **)local_50;
          pcVar12 = "Invalid must restriction \"%s\".";
          goto LAB_001762bc;
        }
        __ptr = lys_path(local_60,1);
        ctx = node->module->ctx;
        pcVar13 = *(char **)local_50;
        pcVar12 = "Invalid must restriction \"%s\" with context node \"%s\".";
        goto LAB_001762bf;
      }
      if ((iVar6 != 0) && (tmp_set.val._8_4_ != 0)) {
        uVar11 = 0;
        do {
          plVar10 = local_48;
          lVar16 = uVar11 * 0x10;
          if (*(int *)(tmp_set._8_8_ + 8 + lVar16) == 2) {
            local_40 = (uint)local_48->flags;
            plVar9 = lys_node_module(local_48);
            tmp_set._56_8_ = plVar10->name;
            uVar2 = (*(lys_node **)(tmp_set._8_8_ + lVar16))->flags;
            mod2 = lys_node_module(*(lys_node **)(tmp_set._8_8_ + lVar16));
            iVar6 = lyp_check_status((uint16_t)local_40,plVar9,(char *)tmp_set._56_8_,uVar2,mod2,
                                     (char *)**(undefined8 **)(tmp_set._8_8_ + lVar16),plVar10);
            if (iVar6 != 0) goto LAB_001762a5;
            if (node_00 != (lys_node *)0x0) {
              plVar10 = *(lys_node **)(tmp_set._8_8_ + lVar16);
              bVar18 = plVar10 != (lys_node *)0x0;
              if (plVar10 != node_00 && bVar18) {
                do {
                  plVar10 = lys_parent(plVar10);
                  bVar18 = plVar10 != (lys_node *)0x0;
                  if (plVar10 == (lys_node *)0x0) break;
                } while (plVar10 != node_00);
              }
              if (!bVar18) {
                plVar10 = *(lys_node **)(tmp_set._8_8_ + lVar16);
                uVar5 = 0x200;
                if (((plVar10->flags & 1) == 0) && (uVar5 = 0x400, (plVar10->flags & 2) == 0)) {
                  while (plVar10->nodetype != LYS_AUGMENT) {
                    plVar10 = plVar10->parent;
                    if (plVar10 == (lys_node *)0x0) goto LAB_0017636d;
                  }
                  plVar9 = lys_node_module(plVar10);
                  if ((plVar9->field_0x40 & 0x80) != 0) {
LAB_0017636d:
                    __assert_fail("elem && !lys_node_module(elem)->implemented",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                                  ,0x2303,
                                  "int lyxp_node_atomize(const struct lys_node *, struct lyxp_set *, int)"
                                 );
                  }
                }
                else {
                  *(ushort *)(local_50 + 0x32) = *(ushort *)(local_50 + 0x32) | uVar5;
                  local_48->flags = local_48->flags | uVar5;
                }
              }
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < (tmp_set.val._8_8_ & 0xffffffff));
      }
      set_snode_merge(set,(lyxp_set *)auStack_b8);
      tmp_set.ht = (hash_table *)0x0;
      tmp_set.ctx_pos = 0;
      tmp_set.ctx_size = 0;
      tmp_set.val._8_8_ = 0;
      tmp_set.used = 0;
      tmp_set.size = 0;
      tmp_set._8_8_ = 0;
      tmp_set.val.nodes = (lyxp_set_node *)0x0;
      auStack_b8 = (undefined1  [8])0x0;
      tmp_set.type = LYXP_SET_EMPTY;
      tmp_set._4_4_ = 0;
      uVar14 = uVar14 + 1;
    } while (uVar14 != bVar15);
  }
  __ptr = (char *)0x0;
  iVar6 = 0;
LAB_001762f7:
  free(__ptr);
  return iVar6;
LAB_001762a5:
  __ptr = (char *)0x0;
  goto LAB_001762d3;
}

Assistant:

int
lyxp_node_atomize(const struct lys_node *node, struct lyxp_set *set, int set_ext_dep_flags)
{
    struct lys_node *parent, *elem;
    const struct lys_node *ctx_snode = NULL;
    struct lyxp_set tmp_set;
    uint8_t must_size = 0;
    uint32_t i, j;
    int opts, ret = EXIT_SUCCESS;
    struct lys_when *when = NULL;
    struct lys_restr *must = NULL;
    char *path = NULL;

    memset(&tmp_set, 0, sizeof tmp_set);
    memset(set, 0, sizeof *set);

    /* check if we will be traversing RPC output */
    opts = 0;
    for (parent = (struct lys_node *)node; parent && (parent->nodetype != LYS_OUTPUT); parent = lys_parent(parent));
    if (parent) {
        opts |= LYXP_SNODE_OUTPUT;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        when = ((struct lys_node_container *)node)->when;
        must = ((struct lys_node_container *)node)->must;
        must_size = ((struct lys_node_container *)node)->must_size;
        break;
    case LYS_CHOICE:
        when = ((struct lys_node_choice *)node)->when;
        break;
    case LYS_LEAF:
        when = ((struct lys_node_leaf *)node)->when;
        must = ((struct lys_node_leaf *)node)->must;
        must_size = ((struct lys_node_leaf *)node)->must_size;
        break;
    case LYS_LEAFLIST:
        when = ((struct lys_node_leaflist *)node)->when;
        must = ((struct lys_node_leaflist *)node)->must;
        must_size = ((struct lys_node_leaflist *)node)->must_size;
        break;
    case LYS_LIST:
        when = ((struct lys_node_list *)node)->when;
        must = ((struct lys_node_list *)node)->must;
        must_size = ((struct lys_node_list *)node)->must_size;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        when = ((struct lys_node_anydata *)node)->when;
        must = ((struct lys_node_anydata *)node)->must;
        must_size = ((struct lys_node_anydata *)node)->must_size;
        break;
    case LYS_CASE:
        when = ((struct lys_node_case *)node)->when;
        break;
    case LYS_NOTIF:
        must = ((struct lys_node_notif *)node)->must;
        must_size = ((struct lys_node_notif *)node)->must_size;
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        must = ((struct lys_node_inout *)node)->must;
        must_size = ((struct lys_node_inout *)node)->must_size;
        break;
    case LYS_USES:
        when = ((struct lys_node_uses *)node)->when;
        break;
    case LYS_AUGMENT:
        when = ((struct lys_node_augment *)node)->when;
        break;
    default:
        /* nothing to check */
        break;
    }

    if (set_ext_dep_flags) {
        /* find operation if in one, used later */
        for (parent = (struct lys_node *)node;
             parent && !(parent->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF));
             parent = lys_parent(parent));
    }

    /* check "when" */
    if (when) {
        if (lyxp_atomize(when->cond, node, LYXP_NODE_ELEM, &tmp_set, LYXP_SNODE_WHEN | opts, &ctx_snode)) {
            free(tmp_set.val.snodes);
            if (ctx_snode) {
                path = lys_path(ctx_snode, LYS_PATH_FIRST_PREFIX);
                LOGVAL(node->module->ctx, LYE_SPEC, LY_VLOG_LYS, node,
                       "Invalid when condition \"%s\" with context node \"%s\".", when->cond, path);
            } else {
                LOGVAL(node->module->ctx, LYE_SPEC, LY_VLOG_LYS, node, "Invalid when condition \"%s\".", when->cond);
            }
            ret = -1;
            goto finish;
        } else {
            if (set_ext_dep_flags) {
                for (j = 0; j < tmp_set.used; ++j) {
                    /* skip roots'n'stuff */
                    if (tmp_set.val.snodes[j].type == LYXP_NODE_ELEM) {
                        /* XPath expression cannot reference "lower" status than the node that has the definition */
                        if (lyp_check_status(node->flags, lys_node_module(node), node->name, tmp_set.val.snodes[j].snode->flags,
                                lys_node_module(tmp_set.val.snodes[j].snode), tmp_set.val.snodes[j].snode->name, node)) {
                            ret = -1;
                            goto finish;
                        }

                        if (parent) {
                            for (elem = tmp_set.val.snodes[j].snode; elem && (elem != parent); elem = lys_parent(elem));
                            if (!elem) {
                                /* not in node's RPC or notification subtree, set the correct dep flag */
                                if (tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_W) {
                                    when->flags |= LYS_XPCONF_DEP;
                                    ((struct lys_node *)node)->flags |= LYS_XPCONF_DEP;
                                } else {
                                    assert(tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_R);
                                    when->flags |= LYS_XPSTATE_DEP;
                                    ((struct lys_node *)node)->flags |= LYS_XPSTATE_DEP;
                                }
                            }
                        }
                    }
                }
            }
            set_snode_merge(set, &tmp_set);
            memset(&tmp_set, 0, sizeof tmp_set);
        }
    }

    /* check "must" */
    for (i = 0; i < must_size; ++i) {
        if (lyxp_atomize(must[i].expr, node, LYXP_NODE_ELEM, &tmp_set, LYXP_SNODE_MUST | opts, &ctx_snode)) {
            free(tmp_set.val.snodes);
            if (ctx_snode) {
                path = lys_path(ctx_snode, LYS_PATH_FIRST_PREFIX);
                LOGVAL(node->module->ctx, LYE_SPEC, LY_VLOG_LYS, node,
                       "Invalid must restriction \"%s\" with context node \"%s\".", must[i].expr, path);
            } else {
                LOGVAL(node->module->ctx, LYE_SPEC, LY_VLOG_LYS, node, "Invalid must restriction \"%s\".", must[i].expr);
            }
            ret = -1;
            goto finish;
        } else {
            if (set_ext_dep_flags) {
                for (j = 0; j < tmp_set.used; ++j) {
                    /* skip roots'n'stuff */
                    if (tmp_set.val.snodes[j].type == LYXP_NODE_ELEM) {
                        /* XPath expression cannot reference "lower" status than the node that has the definition */
                        if (lyp_check_status(node->flags, lys_node_module(node), node->name, tmp_set.val.snodes[j].snode->flags,
                                lys_node_module(tmp_set.val.snodes[j].snode), tmp_set.val.snodes[j].snode->name, node)) {
                            ret = -1;
                            goto finish;
                        }

                        if (parent) {
                            for (elem = tmp_set.val.snodes[j].snode; elem && (elem != parent); elem = lys_parent(elem));
                            if (!elem) {
                                /* not in node's RPC or notification subtree, set the correct dep flag */
                                if (tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_W) {
                                    must[i].flags |= LYS_XPCONF_DEP;
                                    ((struct lys_node *)node)->flags |= LYS_XPCONF_DEP;
                                } else if (tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_R) {
                                    must[i].flags |= LYS_XPSTATE_DEP;
                                    ((struct lys_node *)node)->flags |= LYS_XPSTATE_DEP;
                                } else {
                                    /* only possible if the node is in an unimplemented augment */
                                    elem = tmp_set.val.snodes[j].snode;
                                    while (elem && (elem->nodetype != LYS_AUGMENT)) {
                                        elem = elem->parent;
                                    }
                                    assert(elem && !lys_node_module(elem)->implemented);
                                }
                            }
                        }
                    }
                }
            }
            set_snode_merge(set, &tmp_set);
            memset(&tmp_set, 0, sizeof tmp_set);
        }
    }

finish:
    if (ret) {
        free(set->val.snodes);
        memset(set, 0, sizeof *set);
    }
    free(path);
    return ret;
}